

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::Store<unsigned_long>(Memory *this,u64 offset,u64 addend,unsigned_long val)

{
  bool bVar1;
  uchar *dst;
  size_type dsize;
  unsigned_long local_30;
  unsigned_long val_local;
  u64 addend_local;
  u64 offset_local;
  Memory *this_local;
  
  local_30 = val;
  val_local = addend;
  addend_local = offset;
  offset_local = (u64)this;
  bVar1 = IsValidAccess(this,offset,addend,8);
  if (bVar1) {
    dst = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data_);
    dsize = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
    MemcpyEndianAware(dst,&local_30,dsize,8,addend_local + val_local,0,8);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WABT_VECTORCALL Memory::Store(u64 offset, u64 addend, T val) {
  if (!IsValidAccess(offset, addend, sizeof(T))) {
    return Result::Error;
  }
  MemcpyEndianAware(data_.data(), &val, data_.size(), sizeof(T),
                    offset + addend, 0, sizeof(T));
  return Result::Ok;
}